

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

bool ot::commissioner::coap::Message::IsValidOption(OptionType aNumber,OptionValue *aValue)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  bool bVar4;
  bool bVar5;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,aNumber);
  if (0x22 < iVar3) {
    if (iVar3 == 0x23) {
      puVar1 = (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar2 = (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = puVar1 != puVar2;
      bVar5 = (ulong)((long)puVar1 - (long)puVar2) < 0x40b;
      goto LAB_001f6668;
    }
    if (iVar3 != 0x27) {
      if (iVar3 != 0x3c) {
        return false;
      }
      goto switchD_001f65e2_caseD_e;
    }
switchD_001f65e2_caseD_3:
    puVar1 = (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar4 = puVar1 != puVar2;
    bVar5 = (ulong)((long)puVar1 - (long)puVar2) < 0x100;
LAB_001f6668:
    return (bool)(bVar5 & bVar4);
  }
  switch(iVar3) {
  case 1:
    bVar4 = (ulong)((long)(aValue->mValue).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(aValue->mValue).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) < 9;
    break;
  default:
    return false;
  case 3:
    goto switchD_001f65e2_caseD_3;
  case 4:
    puVar1 = (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar4 = puVar1 != puVar2;
    bVar5 = (ulong)((long)puVar1 - (long)puVar2) < 9;
    goto LAB_001f6668;
  case 5:
    return (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish ==
           (aValue->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  case 7:
  case 0xc:
  case 0x11:
    bVar4 = (ulong)((long)(aValue->mValue).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(aValue->mValue).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) < 3;
    break;
  case 8:
  case 0xb:
  case 0xf:
  case 0x14:
    bVar4 = (ulong)((long)(aValue->mValue).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(aValue->mValue).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) < 0x100;
    break;
  case 0xe:
switchD_001f65e2_caseD_e:
    bVar4 = (ulong)((long)(aValue->mValue).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(aValue->mValue).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) < 5;
  }
  return bVar4;
}

Assistant:

bool Message::IsValidOption(OptionType aNumber, const OptionValue &aValue)
{
    switch (aNumber)
    {
    case OptionType::kIfMatch:
        return aValue.GetLength() <= 8;
    case OptionType::kUriHost:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 255;
    case OptionType::kETag:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 8;
    case OptionType::kIfNonMatch:
        return aValue.GetLength() == 0;
    case OptionType::kUriPort:
        return aValue.GetLength() <= 2;
    case OptionType::kLocationPath:
        return aValue.GetLength() <= 255;
    case OptionType::kUriPath:
        return aValue.GetLength() <= 255;
    case OptionType::kContentFormat:
        return aValue.GetLength() <= 2;
    case OptionType::kMaxAge:
        return aValue.GetLength() <= 4;
    case OptionType::kUriQuery:
        return aValue.GetLength() <= 255;
    case OptionType::kAccept:
        return aValue.GetLength() <= 2;
    case OptionType::kLocationQuery:
        return aValue.GetLength() <= 255;
    case OptionType::kProxyUri:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 1034;
    case OptionType::kProxyScheme:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 255;
    case OptionType::kSize1:
        return aValue.GetLength() <= 4;
    default:
        return false;
    }
}